

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qzip.cpp
# Opt level: O2

void __thiscall QZipReader::QZipReader(QZipReader *this,QString *archive,OpenMode mode)

{
  byte bVar1;
  FileError FVar2;
  QZipReaderPrivate *pQVar3;
  pointer *__ptr;
  undefined4 uVar4;
  long in_FS_OFFSET;
  Data *local_28;
  char16_t *local_20;
  
  local_20 = *(char16_t **)(in_FS_OFFSET + 0x28);
  local_28 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  std::make_unique<QFile,QString_const&>((QString *)&local_28);
  bVar1 = (**(code **)(*(long *)&local_28->super_QArrayData + 0x68))
                    (local_28,mode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                              super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  FVar2 = QFileDevice::error((QFileDevice *)local_28);
  uVar4 = 0;
  if ((bVar1 & FVar2 == NoError) == 0) {
    if (FVar2 == ReadError) {
      uVar4 = 1;
    }
    else if (FVar2 == PermissionsError) {
      uVar4 = 3;
    }
    else if (FVar2 == OpenError) {
      uVar4 = 2;
    }
    else {
      uVar4 = 4;
    }
  }
  pQVar3 = (QZipReaderPrivate *)operator_new(0x48);
  (pQVar3->super_QZipPrivate).device = (QIODevice *)local_28;
  (pQVar3->super_QZipPrivate).ownDevice = true;
  (pQVar3->super_QZipPrivate).dirtyFileTree = true;
  (pQVar3->super_QZipPrivate).fileHeaders.d.d = (Data *)0x0;
  (pQVar3->super_QZipPrivate).fileHeaders.d.ptr = (FileHeader *)0x0;
  (pQVar3->super_QZipPrivate).fileHeaders.d.size = 0;
  (pQVar3->super_QZipPrivate).comment.d.d = (Data *)0x0;
  (pQVar3->super_QZipPrivate).comment.d.ptr = (char *)0x0;
  (pQVar3->super_QZipPrivate).comment.d.size = 0;
  *(undefined8 *)&(pQVar3->super_QZipPrivate).start_of_directory = 0;
  this->d = pQVar3;
  *(undefined4 *)&(pQVar3->super_QZipPrivate).field_0x44 = uVar4;
  if (*(char16_t **)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QZipReader::QZipReader(const QString &archive, QIODevice::OpenMode mode)
{
    auto f = std::make_unique<QFile>(archive);
    const bool result = f->open(mode);
    QZipReader::Status status;
    const QFileDevice::FileError error = f->error();
    if (result && error == QFile::NoError) {
        status = NoError;
    } else {
        if (error == QFile::ReadError)
            status = FileReadError;
        else if (error == QFile::OpenError)
            status = FileOpenError;
        else if (error == QFile::PermissionsError)
            status = FilePermissionsError;
        else
            status = FileError;
    }

    d = new QZipReaderPrivate(f.get(), /*ownDevice=*/true);
    Q_UNUSED(f.release());
    d->status = status;
}